

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmio.c
# Opt level: O3

int mm_read_mtx_crd_size(FILE *f,int *M,int *N,int *nz)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  char line [1025];
  char local_438 [1032];
  
  *nz = 0;
  *N = 0;
  *M = 0;
  do {
    pcVar2 = fgets(local_438,0x401,(FILE *)f);
    if (pcVar2 == (char *)0x0) {
      return 0xc;
    }
  } while (local_438[0] == '%');
  iVar3 = 0;
  iVar1 = __isoc99_sscanf(local_438,"%d %d %d",M,N,nz);
  if (iVar1 != 3) {
    do {
      iVar1 = __isoc99_fscanf(f,"%d %d %d",M,N,nz);
      if (iVar1 == 3) {
        return 0;
      }
    } while (iVar1 != -1);
    iVar3 = 0xc;
  }
  return iVar3;
}

Assistant:

int mm_read_mtx_crd_size(FILE *f, int *M, int *N, int *nz) {
    char line[MM_MAX_LINE_LENGTH];
    int num_items_read;

    /* set return null parameter values, in case we exit with errors */
    *M = *N = *nz = 0;

    /* now continue scanning until you reach the end-of-comments */
    do {
        if (fgets(line, MM_MAX_LINE_LENGTH, f) == NULL)
            return MM_PREMATURE_EOF;
    } while (line[0] == '%');

    /* line[] is either blank or has M,N, nz */
    if (sscanf(line, "%d %d %d", M, N, nz) == 3)
        return 0;

    else
        do {
            num_items_read = fscanf(f, "%d %d %d", M, N, nz);
            if (num_items_read == EOF) return MM_PREMATURE_EOF;
        } while (num_items_read != 3);

    return 0;
}